

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::ExtensionRangeOptions::InternalSwap
          (ExtensionRangeOptions *this,ExtensionRangeOptions *other)

{
  intptr_t iVar1;
  
  internal::ExtensionSet::InternalSwap(&this->_extensions_,&other->_extensions_);
  iVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ =
       (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  (other->super_Message).super_MessageLite._internal_metadata_.ptr_ = iVar1;
  RepeatedPtrField<google::protobuf::UninterpretedOption>::InternalSwap
            (&this->uninterpreted_option_,&other->uninterpreted_option_);
  return;
}

Assistant:

void ExtensionRangeOptions::InternalSwap(ExtensionRangeOptions* other) {
  using std::swap;
  _extensions_.InternalSwap(&other->_extensions_);
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  uninterpreted_option_.InternalSwap(&other->uninterpreted_option_);
}